

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
           *this,PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                 *param_1)

{
  PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  *param_1_local;
  PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  *this_local;
  
  memcpy(this,param_1,0xa8);
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
            (&this->ResourceLayout,&param_1->ResourceLayout);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->StringPool,&param_1->StringPool);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ::vector(&this->Objects,&param_1->Objects);
  std::
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ::vector(&this->Signatures,&param_1->Signatures);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
            (&this->InternalData,&param_1->InternalData);
  return;
}

Assistant:

PipelineStateCreateInfoX(PipelineStateCreateInfoX&&) noexcept = default;